

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valsrc_state.c
# Opt level: O2

int mpt_valsrc_state(mpt_valsrc *src,char *data)

{
  char cVar1;
  ushort *puVar2;
  uint8_t uVar3;
  ushort **ppuVar4;
  long lVar5;
  
  if (data != (char *)0x0) {
    cVar1 = *data;
    if ((long)cVar1 != 0) {
      ppuVar4 = __ctype_b_loc();
      puVar2 = *ppuVar4;
      if ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 4) != 0) {
        if ((*(byte *)((long)puVar2 + (long)data[1] * 2 + 1) & 4) != 0) {
          return -2;
        }
        if (cVar1 == 'A') {
          uVar3 = '\0';
        }
        else if (cVar1 == 'F') {
          uVar3 = '\x03';
        }
        else if (cVar1 == 's') {
          uVar3 = '\x02';
        }
        else if (cVar1 == 'S') {
          uVar3 = '\x05';
        }
        else if (cVar1 == 'a') {
          uVar3 = '\a';
        }
        else if (cVar1 == 'f') {
          uVar3 = '\x04';
        }
        else if (cVar1 == 'i') {
          uVar3 = '\x01';
        }
        else {
          if (cVar1 != 'I') goto LAB_00108291;
          uVar3 = '\x06';
        }
        src->state = uVar3;
        lVar5 = 2;
        while (((ulong)(byte)data[lVar5] != 0 &&
               ((*(byte *)((long)puVar2 + (ulong)(byte)data[lVar5] * 2 + 1) & 0x20) != 0))) {
          lVar5 = lVar5 + 1;
        }
        return (int)lVar5 + -1;
      }
    }
  }
LAB_00108291:
  src->state = '\x02';
  return 0;
}

Assistant:

extern int mpt_valsrc_state(MPT_STRUCT(valsrc) *src, const char *data)
{
	uint8_t state;
	int curr;
	
	/* special validity for binding */
	if (!data || !*data) {
		src->state = MPT_DATASTATE(Step);
		return 0;
	}
	if (!isalpha(*data)) {
		src->state = MPT_DATASTATE(Step);
		return 0;
	}
	if (isalpha(data[1])) {
		return MPT_ERROR(BadValue);
	}
	switch (*data++) {
		case 'i': state = MPT_DATASTATE(Init); break;
		case 'I': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Init); break;
		case 's': state = MPT_DATASTATE(Step); break;
		case 'S': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Step); break;
		case 'f': state = MPT_DATASTATE(Fini); break;
		case 'F': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Fini); break;
		case 'A': state = 0; break;
		case 'a': state = MPT_DATASTATE(All); break;
		default:
			src->state = MPT_DATASTATE(Step);
			return 0;
	}
	src->state = state;
	curr = 1;
	while ((state = *(++data))) {
		if (!isspace(state)) {
			return curr;
		}
		++curr;
	}
	return curr;
}